

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZNLMultGridAnalysis.cpp
# Opt level: O1

void __thiscall
TPZNonLinMultGridAnalysis::SmoothingSolution
          (TPZNonLinMultGridAnalysis *this,REAL tol,int numiter,TPZMaterial *matbase,
          TPZLinearAnalysis *an,TPZFMatrix<double> *rhs)

{
  TPZFMatrix<std::complex<double>_> *pTVar1;
  ESolType EVar2;
  TPZCompMesh *CompMesh;
  TPZBaseMatrix *pTVar3;
  uint uVar4;
  long *plVar5;
  TPZFMatrix<double> *pTVar6;
  ostream *poVar7;
  uint uVar8;
  bool bVar9;
  double dVar10;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  TPZFMatrix<double> rhsim1;
  TPZMaterial *local_1a8;
  undefined8 local_178;
  undefined8 uStack_170;
  code *local_168;
  undefined8 uStack_160;
  TPZFMatrix<double> local_150;
  TPZFMatrix<double> local_c0;
  
  if (matbase == (TPZMaterial *)0x0) {
    local_1a8 = (TPZMaterial *)0x0;
  }
  else {
    local_1a8 = (TPZMaterial *)
                __dynamic_cast(matbase,&TPZMaterial::typeinfo,&TPZMaterialT<double>::typeinfo,0);
  }
  uVar4 = 2;
  if (2 < numiter) {
    uVar4 = numiter;
  }
  CompMesh = (an->super_TPZAnalysis).fCompMesh;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,anon_var_dwarf_2b109cc,0x51);
  plVar5 = (long *)std::ostream::operator<<(&std::cout,0);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  pTVar3 = (an->super_TPZAnalysis).fSolution.fBaseMatrix;
  if (pTVar3 != (TPZBaseMatrix *)0x0) {
    (*(pTVar3->super_TPZSavable)._vptr_TPZSavable[0xf])();
  }
  SetDeltaTime(this,CompMesh,local_1a8);
  (*(an->super_TPZAnalysis).super_TPZSavable._vptr_TPZSavable[0xb])(an,&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"TPZNonLinMultGridAnalysis::SmoothingSolution iteration = ",0x39)
  ;
  plVar5 = (long *)std::ostream::operator<<(&std::cout,1);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  (*(an->super_TPZAnalysis).super_TPZSavable._vptr_TPZSavable[0xc])(an);
  local_168 = (code *)0x0;
  uStack_160 = 0;
  local_178 = 0;
  uStack_170 = 0;
  (**(code **)(*(long *)local_1a8 + 0xa0))(local_1a8,&local_178,0xffffffff);
  if (local_168 != (code *)0x0) {
    (*local_168)(&local_178,&local_178,3);
  }
  EVar2 = (this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution.fSolType;
  if (EVar2 == EComplex) {
    pTVar1 = &(this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution.fComplexMatrix;
    Dot<std::complex<double>>(pTVar1,pTVar1);
    dVar10 = extraout_XMM0_Qa;
  }
  else {
    if (EVar2 != EReal) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"STATE Norm(const TPZSolutionMatrix &)",0x25);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Type is not set. Aborting...\n",0x1d);
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/TPZSolutionMatrix.h"
                 ,0x98);
    }
    pTVar6 = &(this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution.fRealMatrix;
    dVar10 = Dot<double>(pTVar6,pTVar6);
  }
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  pTVar6 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&an->fRhs);
  TPZFMatrix<double>::TPZFMatrix(&local_c0,pTVar6);
  bVar9 = true;
  if (dVar10 < tol) {
    pTVar1 = &(this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution.fComplexMatrix;
    pTVar6 = &(this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution.fRealMatrix;
    uVar8 = 2;
    do {
      pTVar3 = (an->super_TPZAnalysis).fSolution.fBaseMatrix;
      if (pTVar3 != (TPZBaseMatrix *)0x0) {
        (*(pTVar3->super_TPZSavable)._vptr_TPZSavable[0xf])();
      }
      SetDeltaTime(this,CompMesh,local_1a8);
      (*(an->super_TPZAnalysis).super_TPZSavable._vptr_TPZSavable[0xb])(an,&std::cout);
      (*(an->super_TPZAnalysis).super_TPZSavable._vptr_TPZSavable[0xc])(an);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"TPZNonLinMultGridAnalysis::SmoothingSolution iteracao = ",
                 0x38);
      plVar5 = (long *)std::ostream::operator<<(&std::cout,uVar8);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      EVar2 = (this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution.fSolType;
      if (EVar2 == EComplex) {
        Dot<std::complex<double>>(pTVar1,pTVar1);
        dVar10 = extraout_XMM0_Qa_00;
      }
      else {
        if (EVar2 != EReal) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"STATE Norm(const TPZSolutionMatrix &)",0x25);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Type is not set. Aborting...\n",0x1d);
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/TPZSolutionMatrix.h"
                     ,0x98);
        }
        dVar10 = Dot<double>(pTVar6,pTVar6);
      }
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      bVar9 = uVar8 < uVar4;
      if (!bVar9) break;
      uVar8 = uVar8 + 1;
    } while (dVar10 < tol);
  }
  if (bVar9) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "\nTPZNonLinMultGridAnalysis::SmoothingSolution the iterative process stopped",0x4b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," due the great norm of the solution, norm solution = ",0x35);
    poVar7 = std::ostream::_M_insert<double>(dVar10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  (*(an->super_TPZAnalysis).super_TPZSavable._vptr_TPZSavable[0xc])(an);
  pTVar6 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&an->fRhs);
  TPZFMatrix<double>::operator-(&local_150,pTVar6,&local_c0);
  TPZFMatrix<double>::operator=(rhs,&local_150);
  TPZFMatrix<double>::~TPZFMatrix(&local_150);
  TPZFMatrix<double>::~TPZFMatrix(&local_c0);
  return;
}

Assistant:

void TPZNonLinMultGridAnalysis::SmoothingSolution(REAL tol,int numiter,TPZMaterial * matbase,TPZLinearAnalysis &an,TPZFMatrix<STATE> &rhs){
	auto *mat =
		dynamic_cast<TPZMaterialT<STATE>*>(matbase);
	//pelo menos duas iteracoes para calcular o residuo
	if(numiter <= 1) numiter = 2;
	TPZCompMesh *anmesh = an.Mesh();
	int iter = 0;
	cout << "PZAnalysis::SmoothingSolutionTest beginning of the iterative process iterac� = " << iter << endl;
	an.Solution().Zero();
	SetDeltaTime(anmesh,mat);
	an.Run();
	cout << "TPZNonLinMultGridAnalysis::SmoothingSolution iteration = " << ++iter << endl;
	an.LoadSolution();
	mat->SetForcingFunction(nullptr,-1);
	REAL normsol = Norm(Solution());
	TPZFMatrix<STATE> rhsim1 = an.Rhs();
	
	while(iter < numiter && normsol < tol) {
		
		an.Solution().Zero();
		SetDeltaTime(anmesh,mat);
		//    rhsim1 = an.Rhs();//guarda o anterior res�uo
		an.Run();
		an.LoadSolution();
		cout << "TPZNonLinMultGridAnalysis::SmoothingSolution iteracao = " << ++iter << endl;
		normsol = Norm(Solution());
	}
	if(iter < numiter){
		cout << "\nTPZNonLinMultGridAnalysis::SmoothingSolution the iterative process stopped"
		<< " due the great norm of the solution, norm solution = " << normsol << endl;
	}
	an.LoadSolution();
	//TODOCOMPLEX
	TPZFMatrix<STATE> &myrhs = an.Rhs();
	rhs = myrhs - rhsim1;//ltimo residuo - res�uo anterior
}